

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDDMAP mtbdd_map_remove(MTBDDMAP map,uint32_t key)

{
  int iVar1;
  uint32_t var;
  mtbddnode_t n_00;
  MTBDD MVar2;
  MTBDDMAP low_00;
  MTBDDMAP low;
  uint32_t k;
  mtbddnode_t n;
  uint32_t key_local;
  MTBDDMAP map_local;
  
  iVar1 = mtbdd_map_isempty(map);
  map_local = map;
  if (iVar1 == 0) {
    n_00 = MTBDD_GETNODE(map);
    var = mtbddnode_getvariable(n_00);
    if (var < key) {
      MVar2 = mtbddnode_followlow(map,n_00);
      low_00 = mtbdd_map_remove(MVar2,key);
      MVar2 = mtbddnode_followhigh(map,n_00);
      map_local = mtbdd_makemapnode(var,low_00,MVar2);
    }
    else if (var <= key) {
      map_local = mtbddnode_followlow(map,n_00);
    }
  }
  return map_local;
}

Assistant:

MTBDDMAP
mtbdd_map_remove(MTBDDMAP map, uint32_t key)
{
    if (mtbdd_map_isempty(map)) return map;

    mtbddnode_t n = MTBDD_GETNODE(map);
    uint32_t k = mtbddnode_getvariable(n);

    if (k < key) {
        MTBDDMAP low = mtbdd_map_remove(node_getlow(map, n), key);
        return mtbdd_makemapnode(k, low, node_gethigh(map, n));
    } else if (k > key) {
        return map;
    } else {
        return node_getlow(map, n);
    }
}